

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_norm_tec_zone(REF_GRID ref_grid,REF_INT id,FILE *file)

{
  uint uVar1;
  REF_STATUS RVar2;
  int local_180;
  REF_INT local_17c;
  int local_178;
  REF_INT local_174;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL area_sign;
  REF_DBL uv [2];
  REF_DBL n [3];
  REF_DBL local_118;
  REF_DBL s [3];
  REF_DBL local_f8;
  REF_DBL r [3];
  REF_INT ntri;
  REF_INT nnode;
  REF_INT node;
  REF_INT local;
  REF_INT item;
  REF_INT nodes [27];
  int local_50;
  REF_INT local_4c;
  REF_INT cell;
  REF_INT geom;
  REF_DICT ref_dict;
  REF_GEOM ref_geom;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  FILE *file_local;
  REF_GRID pRStack_18;
  REF_INT id_local;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  ref_geom = (REF_GEOM)ref_grid->cell[3];
  ref_dict = (REF_DICT)ref_grid->geom;
  ref_node = (REF_NODE)file;
  file_local._4_4_ = id;
  pRStack_18 = ref_grid;
  uVar1 = ref_dict_create((REF_DICT *)&cell);
  if (uVar1 == 0) {
    for (local_4c = 0; local_4c < ref_dict->max; local_4c = local_4c + 1) {
      if (((ref_dict->key[local_4c * 6] == 2) &&
          (file_local._4_4_ == ref_dict->key[local_4c * 6 + 1])) &&
         (uVar1 = ref_dict_store(_cell,ref_dict->key[local_4c * 6 + 5],local_4c), uVar1 != 0)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xd6f,"ref_geom_norm_tec_zone",(ulong)uVar1,"mark nodes");
        return uVar1;
      }
    }
    uVar1 = _cell->n;
    r[2]._4_4_ = 0;
    for (local_50 = 0; local_50 < *(int *)((long)&ref_geom->initial_cell_height + 4);
        local_50 = local_50 + 1) {
      RVar2 = ref_cell_nodes((REF_CELL)ref_geom,local_50,&local);
      if ((RVar2 == 0) && (file_local._4_4_ == nodes[1])) {
        r[2]._4_4_ = r[2]._4_4_ + 1;
      }
    }
    if ((uVar1 == 0) || (r[2]._4_4_ == 0)) {
      ref_grid_local._4_4_ = ref_dict_free(_cell);
      if (ref_grid_local._4_4_ == 0) {
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xd7d,"ref_geom_norm_tec_zone",(ulong)ref_grid_local._4_4_,"free dict");
      }
    }
    else {
      fprintf((FILE *)ref_node,
              "zone t=\"norm%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
              (ulong)file_local._4_4_,(ulong)uVar1,(ulong)r[2]._4_4_,"point","fetriangle");
      node = 0;
      if (_cell->n < 1) {
        local_174 = -1;
      }
      else {
        local_174 = *_cell->key;
      }
      ntri = local_174;
      if (_cell->n < 1) {
        local_178 = -1;
      }
      else {
        local_178 = *_cell->value;
      }
      local_4c = local_178;
      while (node < _cell->n) {
        uVar1 = ref_geom_find((REF_GEOM)ref_dict,ntri,2,file_local._4_4_,&local_4c);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xd87,"ref_geom_norm_tec_zone",(ulong)uVar1,"not found");
          return uVar1;
        }
        area_sign = *(REF_DBL *)(ref_dict->value + (long)(local_4c << 1) * 2);
        uv[0] = *(REF_DBL *)(ref_dict->value + (long)(local_4c * 2 + 1) * 2);
        uVar1 = ref_geom_face_rsn((REF_GEOM)ref_dict,file_local._4_4_,&area_sign,&local_f8,
                                  &local_118,uv + 1);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xd8a,"ref_geom_norm_tec_zone",(ulong)uVar1,"rsn");
          return uVar1;
        }
        uVar1 = ref_geom_uv_area_sign
                          (pRStack_18,file_local._4_4_,(REF_DBL *)&ref_private_macro_code_rss_1);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xd8b,"ref_geom_norm_tec_zone",(ulong)uVar1,"a sign");
          return uVar1;
        }
        fprintf((FILE *)ref_node," %.16e %.16e %.16e %.16e %.16e %.16e\n",
                *(undefined8 *)(ref_cell->c2n + (long)(ntri * 0xf) * 2),
                *(undefined8 *)(ref_cell->c2n + (long)(ntri * 0xf + 1) * 2),
                *(undefined8 *)(ref_cell->c2n + (long)(ntri * 0xf + 2) * 2),
                -_ref_private_macro_code_rss_1 * uv[1],-_ref_private_macro_code_rss_1 * n[0],
                -_ref_private_macro_code_rss_1 * n[1]);
        node = node + 1;
        if ((node < 0) || (_cell->n <= node)) {
          local_17c = -1;
        }
        else {
          local_17c = _cell->key[node];
        }
        ntri = local_17c;
        if ((node < 0) || (_cell->n <= node)) {
          local_180 = -1;
        }
        else {
          local_180 = _cell->value[node];
        }
        local_4c = local_180;
      }
      for (local_50 = 0; local_50 < *(int *)((long)&ref_geom->initial_cell_height + 4);
          local_50 = local_50 + 1) {
        RVar2 = ref_cell_nodes((REF_CELL)ref_geom,local_50,&local);
        if ((RVar2 == 0) && (file_local._4_4_ == nodes[1])) {
          for (ntri = 0; ntri < 3; ntri = ntri + 1) {
            uVar1 = ref_dict_location(_cell,(&local)[ntri],&nnode);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xd95,"ref_geom_norm_tec_zone",(ulong)uVar1,"localize");
              return uVar1;
            }
            fprintf((FILE *)ref_node," %d",(ulong)(nnode + 1));
          }
          fprintf((FILE *)ref_node,"\n");
        }
      }
      ref_grid_local._4_4_ = ref_dict_free(_cell);
      if (ref_grid_local._4_4_ == 0) {
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xd9c,"ref_geom_norm_tec_zone",(ulong)ref_grid_local._4_4_,"free dict");
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xd6a,
           "ref_geom_norm_tec_zone",(ulong)uVar1,"create dict");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_norm_tec_zone(REF_GRID ref_grid, REF_INT id,
                                          FILE *file) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_DICT ref_dict;
  REF_INT geom, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, local, node;
  REF_INT nnode, ntri;
  REF_DBL r[3], s[3], n[3], uv[2];
  REF_DBL area_sign;

  RSS(ref_dict_create(&ref_dict), "create dict");

  each_ref_geom_face(ref_geom, geom) {
    if (id == ref_geom_id(ref_geom, geom)) {
      RSS(ref_dict_store(ref_dict, ref_geom_node(ref_geom, geom), geom),
          "mark nodes");
    }
  }
  nnode = ref_dict_n(ref_dict);

  ntri = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[3]) {
      ntri++;
    }
  }

  /* skip degenerate */
  if (0 == nnode || 0 == ntri) {
    RSS(ref_dict_free(ref_dict), "free dict");
    return REF_SUCCESS;
  }

  fprintf(
      file,
      "zone t=\"norm%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
      id, nnode, ntri, "point", "fetriangle");

  each_ref_dict_key_value(ref_dict, item, node, geom) {
    RSS(ref_geom_find(ref_geom, node, REF_GEOM_FACE, id, &geom), "not found");
    uv[0] = ref_geom_param(ref_geom, 0, geom);
    uv[1] = ref_geom_param(ref_geom, 1, geom);
    RSS(ref_geom_face_rsn(ref_geom, id, uv, r, s, n), "rsn");
    RSS(ref_geom_uv_area_sign(ref_grid, id, &area_sign), "a sign");
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e\n",
            ref_node_xyz(ref_node, 0, node), ref_node_xyz(ref_node, 1, node),
            ref_node_xyz(ref_node, 2, node), -area_sign * n[0],
            -area_sign * n[1], -area_sign * n[2]);
  }

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[3]) {
      for (node = 0; node < 3; node++) {
        RSS(ref_dict_location(ref_dict, nodes[node], &local), "localize");
        fprintf(file, " %d", local + 1);
      }
      fprintf(file, "\n");
    }
  }

  RSS(ref_dict_free(ref_dict), "free dict");

  return REF_SUCCESS;
}